

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionStarting(XmlReporter *this,SectionInfo *sectionInfo)

{
  int iVar1;
  XmlFormatting fmt;
  XmlWriter *this_00;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  SectionInfo *local_18;
  SectionInfo *sectionInfo_local;
  XmlReporter *this_local;
  
  local_18 = sectionInfo;
  sectionInfo_local = (SectionInfo *)this;
  StreamingReporterBase<Catch::XmlReporter>::sectionStarting
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,sectionInfo);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + 1;
  if (0 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Section",&local_39);
    fmt = operator|(Newline,Indent);
    this_00 = XmlWriter::startElement(&this->m_xml,&local_38,fmt);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"name",&local_71);
    trim(&local_98,&local_18->name);
    XmlWriter::writeAttribute(this_00,&local_70,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    writeSourceInfo(this,&local_18->lineInfo);
    XmlWriter::ensureTagClosed(&this->m_xml);
  }
  return;
}

Assistant:

void XmlReporter::sectionStarting( SectionInfo const& sectionInfo ) {
        StreamingReporterBase::sectionStarting( sectionInfo );
        if( m_sectionDepth++ > 0 ) {
            m_xml.startElement( "Section" )
                .writeAttribute( "name", trim( sectionInfo.name ) );
            writeSourceInfo( sectionInfo.lineInfo );
            m_xml.ensureTagClosed();
        }
    }